

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qabstractitemmodel.cpp
# Opt level: O2

void __thiscall QAbstractItemModel::endMoveRows(QAbstractItemModel *this)

{
  QStack<QAbstractItemModelPrivate::Change> *this_00;
  QAbstractItemModelPrivate *this_01;
  int iVar1;
  long in_FS_OFFSET;
  Change removeChange;
  Change insertChange;
  undefined8 local_d8;
  undefined1 *puStack_d0;
  totally_ordered_wrapper<const_QAbstractItemModel_*> local_c8;
  undefined8 local_b8;
  undefined1 *puStack_b0;
  totally_ordered_wrapper<const_QAbstractItemModel_*> local_a8;
  undefined1 *local_98;
  undefined1 *puStack_90;
  totally_ordered_wrapper<const_QAbstractItemModel_*> local_88;
  undefined8 uStack_80;
  undefined1 *local_78;
  undefined1 *local_68;
  undefined1 *puStack_60;
  totally_ordered_wrapper<const_QAbstractItemModel_*> local_58;
  undefined1 *puStack_50;
  undefined1 *local_48;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  this_01 = *(QAbstractItemModelPrivate **)(this + 8);
  local_48 = &DAT_aaaaaaaaaaaaaaaa;
  local_58.ptr = (QAbstractItemModel *)&DAT_aaaaaaaaaaaaaaaa;
  puStack_50 = &DAT_aaaaaaaaaaaaaaaa;
  local_68 = &DAT_aaaaaaaaaaaaaaaa;
  puStack_60 = &DAT_aaaaaaaaaaaaaaaa;
  this_00 = &this_01->changes;
  QList<QAbstractItemModelPrivate::Change>::takeLast
            ((value_type *)&local_68,&this_00->super_QList<QAbstractItemModelPrivate::Change>);
  local_78 = &DAT_aaaaaaaaaaaaaaaa;
  local_88.ptr = (QAbstractItemModel *)&DAT_aaaaaaaaaaaaaaaa;
  uStack_80 = &DAT_aaaaaaaaaaaaaaaa;
  local_98 = &DAT_aaaaaaaaaaaaaaaa;
  puStack_90 = &DAT_aaaaaaaaaaaaaaaa;
  QList<QAbstractItemModelPrivate::Change>::takeLast
            ((value_type *)&local_98,&this_00->super_QList<QAbstractItemModelPrivate::Change>);
  local_a8.ptr = local_88.ptr;
  local_b8 = local_98;
  puStack_b0 = puStack_90;
  local_c8.ptr = local_58.ptr;
  local_d8 = local_68;
  puStack_d0 = puStack_60;
  iVar1 = (uStack_80._4_4_ - (int)uStack_80) + 1;
  if (local_48._0_1_ == true) {
    local_d8._0_4_ = (int)local_68;
    local_d8 = (undefined1 *)CONCAT44((int)((ulong)local_68 >> 0x20),(int)local_d8 - iVar1);
    local_c8.ptr = (QAbstractItemModel *)this;
  }
  if (local_78._0_1_ == true) {
    local_b8._0_4_ = (int)local_98;
    local_b8 = (undefined1 *)CONCAT44((int)((ulong)local_98 >> 0x20),(int)local_b8 + iVar1);
    local_a8.ptr = (QAbstractItemModel *)this;
  }
  QAbstractItemModelPrivate::itemsMoved
            (this_01,(QModelIndex *)&local_b8,(int)uStack_80,uStack_80._4_4_,
             (QModelIndex *)&local_d8,(int)puStack_50,Vertical);
  rowsMoved(this,(QModelIndex *)&local_b8,(ulong)uStack_80 & 0xffffffff,uStack_80._4_4_,
            (QModelIndex *)&local_d8,(ulong)puStack_50 & 0xffffffff);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QAbstractItemModel::endMoveRows()
{
    Q_D(QAbstractItemModel);

    QAbstractItemModelPrivate::Change insertChange = d->changes.pop();
    QAbstractItemModelPrivate::Change removeChange = d->changes.pop();

    QModelIndex adjustedSource = removeChange.parent;
    QModelIndex adjustedDestination = insertChange.parent;

    const int numMoved = removeChange.last - removeChange.first + 1;
    if (insertChange.needsAdjust)
      adjustedDestination = createIndex(adjustedDestination.row() - numMoved, adjustedDestination.column(), adjustedDestination.internalPointer());

    if (removeChange.needsAdjust)
      adjustedSource = createIndex(adjustedSource.row() + numMoved, adjustedSource.column(), adjustedSource.internalPointer());

    d->itemsMoved(adjustedSource, removeChange.first, removeChange.last, adjustedDestination, insertChange.first, Qt::Vertical);

    emit rowsMoved(adjustedSource, removeChange.first, removeChange.last, adjustedDestination, insertChange.first, QPrivateSignal());
}